

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O1

flatcc_builder_union_vec_ref_t flatcc_builder_end_union_vector(flatcc_builder_t *B)

{
  uint uVar1;
  uint8_t *puVar2;
  __flatcc_builder_frame_t *p_Var3;
  int iVar4;
  flatcc_builder_union_vec_ref_t fVar5;
  ulong uVar6;
  uint uVar7;
  ulong count;
  flatcc_builder_ref_t *data;
  
  if (B->frame->type != 7) {
    __assert_fail("(B->frame[0].type) == flatcc_builder_union_vector",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x676,
                  "flatcc_builder_union_vec_ref_t flatcc_builder_end_union_vector(flatcc_builder_t *)"
                 );
  }
  uVar7 = (B->frame->container).table.pl_end;
  count = (ulong)uVar7;
  uVar1 = B->ds_offset;
  uVar7 = uVar7 * 5 + uVar1;
  B->ds_offset = uVar7;
  if (B->ds_limit <= uVar7) {
    iVar4 = reserve_ds(B,(ulong)(uVar7 + 1),0xfffffffc);
    if (iVar4 != 0) {
      data = (flatcc_builder_ref_t *)0x0;
      goto LAB_00106b4b;
    }
  }
  data = (flatcc_builder_ref_t *)(B->ds + uVar1);
LAB_00106b4b:
  if (data == (flatcc_builder_ref_t *)0x0) {
    fVar5.type = 0;
    fVar5.value = 0;
  }
  else {
    if (count != 0) {
      puVar2 = B->ds;
      uVar6 = 0;
      do {
        *(uint8_t *)((long)(data + count) + uVar6) = puVar2[uVar6 * 8];
        data[uVar6] = *(flatcc_builder_ref_t *)(puVar2 + uVar6 * 8 + 4);
        uVar6 = uVar6 + 1;
      } while (count != uVar6);
    }
    fVar5 = flatcc_builder_create_union_vector_direct
                      (B,(flatcc_builder_utype_t *)(data + count),data,count);
    memset(B->ds,0,(ulong)B->ds_offset);
    p_Var3 = B->frame;
    B->ds_offset = p_Var3->ds_offset;
    uVar7 = p_Var3->ds_first;
    B->ds_first = uVar7;
    uVar1 = p_Var3->type_limit;
    B->ds = (uint8_t *)((ulong)uVar7 + (long)B->buffers[1].iov_base);
    uVar7 = (int)B->buffers[1].iov_len - uVar7;
    if (uVar1 <= uVar7) {
      uVar7 = uVar1;
    }
    B->ds_limit = uVar7;
    if (B->min_align < B->align) {
      B->min_align = B->align;
    }
    B->align = p_Var3->align;
    B->frame = p_Var3 + -1;
    B->level = B->level + -1;
  }
  return fVar5;
}

Assistant:

flatcc_builder_union_vec_ref_t flatcc_builder_end_union_vector(flatcc_builder_t *B)
{
    flatcc_builder_union_vec_ref_t uvref = { 0, 0 };
    flatcc_builder_utype_t *types;
    flatcc_builder_union_ref_t *urefs;
    flatcc_builder_ref_t *refs;
    size_t i, count;

    check(frame(type) == flatcc_builder_union_vector, "expected union vector frame");

    /*
     * We could split the union vector in-place, but then we would have
     * to deal with strict pointer aliasing rules which is not worthwhile
     * so we create a new offset and type vector on the stack.
     *
     * We assume the stack is sufficiently aligned as is.
     */
    count = flatcc_builder_union_vector_count(B);
    if (0 == (refs = push_ds(B, (uoffset_t)(count * (utype_size + field_size))))) {
        return uvref;
    }
    types = (flatcc_builder_utype_t *)(refs + count);

    /* Safe even if push_ds caused stack reallocation. */
    urefs = flatcc_builder_union_vector_edit(B);

    for (i = 0; i < count; ++i) {
        types[i] = urefs[i].type;
        refs[i] = urefs[i].value;
    }
    uvref = flatcc_builder_create_union_vector_direct(B, types, refs, count);
    /* No need to clean up after out temporary types vector. */
    exit_frame(B);
    return uvref;
}